

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

int restincurl::RequestBuilder::debug_callback
              (CURL *handle,curl_infotype type,char *data,size_t size,void *userp)

{
  ostream *poVar1;
  long lVar2;
  string msg;
  char *local_48;
  long local_40;
  char local_38;
  undefined7 uStack_37;
  
  local_40 = 0;
  local_38 = '\0';
  local_48 = &local_38;
  if (type < 8) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_48,0,(char *)0x0,
               (ulong)(&DAT_0010eb28 + *(int *)(&DAT_0010eb28 + (ulong)type * 4)));
  }
  if (0 < (long)size) {
    lVar2 = size + 1;
    do {
      std::__cxx11::string::push_back((char)&local_48);
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  poVar1 = std::ostream::_M_insert<void_const*>(&std::clog);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_48,local_40);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return 0;
}

Assistant:

static int debug_callback(CURL *handle, curl_infotype type,
             char *data, size_t size,
             void *userp) {

            std::string msg;
            switch(type) {
            case CURLINFO_TEXT:
                msg = "==> Info: ";
                break;
            case CURLINFO_HEADER_OUT:
                msg =  "=> Send header: ";
                break;
            case CURLINFO_DATA_OUT:
                msg = "=> Send data: ";
                break;
            case CURLINFO_SSL_DATA_OUT:
                msg = "=> Send SSL data: ";
                break;
            case CURLINFO_HEADER_IN:
                msg = "<= Recv header: ";
                break;
            case CURLINFO_DATA_IN:
                msg = "<= Recv data: ";
                break;
            case CURLINFO_SSL_DATA_IN:
                msg = "<= Recv SSL data: ";
                break;
            case CURLINFO_END: // Don't seems to be used
                msg = "<= End: ";
                break;
            }

            std::copy(data, data + size, std::back_inserter(msg));
            RESTINCURL_LOG(handle << " " << msg);
            return 0;
        }